

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.hh
# Opt level: O3

void __thiscall
std::
_Sp_counted_ptr_inplace<Pl_ASCII85Decoder,_std::allocator<Pl_ASCII85Decoder>,_(__gnu_cxx::_Lock_policy)2>
::_M_dispose(_Sp_counted_ptr_inplace<Pl_ASCII85Decoder,_std::allocator<Pl_ASCII85Decoder>,_(__gnu_cxx::_Lock_policy)2>
             *this)

{
  long *plVar1;
  long *plVar2;
  
  (this->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__Pipeline_0033db30;
  plVar1 = *(long **)((long)&(this->_M_impl)._M_storage._M_storage + 8);
  plVar2 = (long *)((long)&(this->_M_impl)._M_storage._M_storage + 0x18);
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Pipeline() = default;